

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct2.cpp
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  span_t span;
  basis_t bs;
  basis basis;
  graph lat;
  unitcell unitcell;
  DenseStorage<long,__1,__1,__1,_0> local_108;
  DenseStorage<double,__1,__1,__1,_0> local_e8;
  vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> local_c8;
  basis local_b0;
  graph local_98;
  unitcell local_48;
  
  local_e8.m_data = (double *)0x0;
  local_e8.m_rows = 0;
  local_e8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_e8,1,1,1);
  *local_e8.m_data = 1.0;
  lattice::basis::basis(&local_b0,(basis_t *)&local_e8);
  local_48.dim_ = 1;
  local_48.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.dim_ = (size_t)malloc(8);
  if ((undefined8 *)local_98.dim_ == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = operator_new;
    __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_98.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  *(undefined8 *)local_98.dim_ = 0;
  lattice::unitcell::add_site(&local_48,(coordinate_t *)&local_98,0);
  free((void *)local_98.dim_);
  puVar1 = (undefined8 *)malloc(8);
  if (puVar1 != (undefined8 *)0x0) {
    local_98.sites_.
    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    *puVar1 = 1;
    local_98.dim_ = (size_t)puVar1;
    lattice::unitcell::add_bond(&local_48,0,0,(offset_t *)&local_98,0);
    free((void *)local_98.dim_);
    local_108.m_data = (long *)0x0;
    local_108.m_rows = 0;
    local_108.m_cols = 0;
    Eigen::DenseStorage<long,_-1,_-1,_-1,_0>::resize(&local_108,1,1,1);
    *local_108.m_data = 0x10;
    local_c8.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_c8.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>.
         _M_impl.super__Vector_impl_data._M_start + 1;
    *local_c8.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
     super__Vector_impl_data._M_start = periodic;
    local_c8.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_c8.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    lattice::graph::graph(&local_98,&local_b0,&local_48,(span_t *)&local_108,&local_c8);
    lattice::graph::print(&local_98,(ostream *)&std::cout);
    if (local_98.bonds_.
        super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.bonds_.
                      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.bonds_.
                            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.bonds_.
                            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&local_98.coordinates_);
    std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
              (&local_98.sites_);
    if (local_c8.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    free(local_108.m_data);
    std::vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>::~vector
              (&local_48.bonds_);
    std::vector<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>::~vector
              (&local_48.sites_);
    free(local_b0.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    free(local_e8.m_data);
    return 0;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = operator_new;
  __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

int main() {
  lattice::basis_t bs(1, 1); bs << 1; // 1x1 matrix
  lattice::basis basis(bs);
  lattice::unitcell unitcell(1);
  unitcell.add_site(lattice::coordinate(0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1), 0);
  lattice::span_t span(1, 1); span << 16; // 1x1 matrix
  std::vector<lattice::boundary_t> boundary(1, lattice::boundary_t::periodic);
  lattice::graph lat(basis, unitcell, span, boundary);
  lat.print(std::cout);
}